

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.h
# Opt level: O3

void __thiscall WebServer::~WebServer(WebServer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->sql).super___shared_ptr<SQLConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->users)._M_h);
  pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<HttpConn>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpConn>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->connPool_).usedConnMap_._M_h);
  std::__cxx11::_List_base<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>::
  _M_clear(&(this->connPool_).freeConnPool_.
            super__List_base<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>
          );
  p_Var1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::~unique_ptr
            (&this->reactorPool_);
  return;
}

Assistant:

~WebServer() {}